

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_dep_add_subtree(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  int iVar1;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_stream *dep_stream_local;
  
  dep_stream->sum_dep_weight = stream->weight + dep_stream->sum_dep_weight;
  if (dep_stream->dep_next == (nghttp2_stream *)0x0) {
    link_dep(dep_stream,stream);
  }
  else {
    insert_link_dep(dep_stream,stream);
  }
  iVar1 = stream_subtree_active(stream);
  if ((iVar1 == 0) ||
     (dep_stream_local._4_4_ = stream_obq_push(dep_stream,stream), dep_stream_local._4_4_ == 0)) {
    validate_tree(dep_stream);
    dep_stream_local._4_4_ = 0;
  }
  return dep_stream_local._4_4_;
}

Assistant:

int nghttp2_stream_dep_add_subtree(nghttp2_stream *dep_stream,
                                   nghttp2_stream *stream) {
  int rv;

  DEBUGF("stream: dep_add_subtree dep_stream(%p)=%d stream(%p)=%d\n",
         dep_stream, dep_stream->stream_id, stream, stream->stream_id);

  dep_stream->sum_dep_weight += stream->weight;

  if (dep_stream->dep_next) {
    insert_link_dep(dep_stream, stream);
  } else {
    link_dep(dep_stream, stream);
  }

  if (stream_subtree_active(stream)) {
    rv = stream_obq_push(dep_stream, stream);
    if (rv != 0) {
      return rv;
    }
  }

  validate_tree(dep_stream);

  return 0;
}